

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::NumberStringBuilder::getAllFieldPositions
          (NumberStringBuilder *this,FieldPositionIteratorHandler *fpih,UErrorCode *status)

{
  UNumberFormatFields UVar1;
  uint uVar2;
  ValueOrHeapArray<UNumberFormatFields> *pVVar3;
  UNumberFormatFields UVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  uint local_34;
  
  uVar5 = 0xb;
  local_34 = 0xffffffff;
  uVar7 = 0;
  do {
    uVar6 = (uint)uVar7;
    UVar4 = (UNumberFormatFields)uVar5;
    if (this->fLength <= (int)uVar6) {
      if (UVar4 == UNUM_FIELD_COUNT) {
        return;
      }
      (*(fpih->super_FieldPositionHandler)._vptr_FieldPositionHandler[2])
                (fpih,uVar5,(ulong)local_34);
      return;
    }
    pVVar3 = &this->fFields;
    if (this->fUsingHeap != false) {
      pVVar3 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
    }
    UVar1 = pVVar3->value[(long)this->fZero + uVar7];
    uVar2 = local_34;
    if (UVar1 == UNUM_GROUPING_SEPARATOR_FIELD && UVar4 == UNUM_INTEGER_FIELD) {
      (*(fpih->super_FieldPositionHandler)._vptr_FieldPositionHandler[2])
                (fpih,6,uVar7 & 0xffffffff,(ulong)(uVar6 + 1));
      UVar4 = UNUM_INTEGER_FIELD;
    }
    else if ((UVar4 != UVar1) &&
            (bVar8 = UVar4 != UNUM_FIELD_COUNT, UVar4 = UVar1, uVar2 = uVar6, bVar8)) {
      (*(fpih->super_FieldPositionHandler)._vptr_FieldPositionHandler[2])
                (fpih,uVar5,(ulong)local_34,uVar7 & 0xffffffff);
    }
    local_34 = uVar2;
    uVar7 = uVar7 + 1;
    uVar5 = (ulong)UVar4;
  } while (*status < U_ILLEGAL_ARGUMENT_ERROR);
  return;
}

Assistant:

void NumberStringBuilder::getAllFieldPositions(FieldPositionIteratorHandler& fpih,
                                               UErrorCode& status) const {
    Field current = UNUM_FIELD_COUNT;
    int32_t currentStart = -1;
    for (int32_t i = 0; i < fLength; i++) {
        Field field = fieldAt(i);
        if (current == UNUM_INTEGER_FIELD && field == UNUM_GROUPING_SEPARATOR_FIELD) {
            // Special case: GROUPING_SEPARATOR counts as an INTEGER.
            fpih.addAttribute(UNUM_GROUPING_SEPARATOR_FIELD, i, i + 1);
        } else if (current != field) {
            if (current != UNUM_FIELD_COUNT) {
                fpih.addAttribute(current, currentStart, i);
            }
            current = field;
            currentStart = i;
        }
        if (U_FAILURE(status)) {
            return;
        }
    }
    if (current != UNUM_FIELD_COUNT) {
        fpih.addAttribute(current, currentStart, fLength);
    }
}